

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O3

string * var_to_str<long,2ul>(string *__return_storage_ptr__,array<long,_2UL> *x)

{
  bool bVar1;
  bool bVar2;
  string *psVar3;
  bool bVar4;
  long lVar5;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"[","");
  bVar2 = false;
  lVar5 = 0;
  bVar1 = true;
  do {
    bVar4 = bVar1;
    if (bVar2) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    var_to_str<long>(&local_50,(long *)x->_M_elems[lVar5]);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    lVar5 = 1;
    bVar2 = true;
    bVar1 = false;
  } while (bVar4);
  psVar3 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
  return psVar3;
}

Assistant:

static std::string var_to_str(const std::array<T, N> & x) {
    std::string s = "[";
    for (size_t i = 0; i < N; i++) {
        if (i > 0) {
            s += ",";
        }
        s += var_to_str(x[i]);
    }
    s += "]";
    return s;
}